

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootchart.c
# Opt level: O0

void bootchart_finish(void)

{
  unlink("/var/log/bootchart-stop");
  file_buff_done((FileBuff)0x10b469);
  file_buff_done((FileBuff)0x10b475);
  file_buff_done((FileBuff)0x10b481);
  acct((char *)0x0);
  return;
}

Assistant:

void  bootchart_finish( void )
{
    unlink( LOG_STOPFILE );
    file_buff_done(log_stat);
    file_buff_done(log_disks);
    file_buff_done(log_procs);
    acct(NULL);
}